

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int use_whip(obj *obj)

{
  char cVar1;
  char cVar2;
  monst *pmVar3;
  short sVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  obj *poVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  undefined8 uVar16;
  monst *worm;
  bool bVar17;
  schar dy;
  schar dx;
  schar dz;
  char buf [256];
  coord cc;
  char premsg [256];
  obj *in_stack_fffffffffffffca8;
  char local_34b;
  char local_34a;
  char local_349;
  long local_348;
  long local_340;
  char local_338 [256];
  coord local_238 [128];
  char local_138 [264];
  
  if (uwep == obj) {
    iVar8 = 0;
  }
  else {
    bVar5 = wield_tool(obj,"lash");
    iVar8 = 1;
    if (bVar5 == '\0') {
      return 0;
    }
  }
  iVar7 = getdir((char *)0x0,&local_34a,&local_34b,&local_349);
  if (iVar7 == 0) {
    return iVar8;
  }
  if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c')
      ) || ((u.uprops[0x1c].intrinsic != 0 &&
            (uVar13 = mt_random(), uVar13 * -0x33333333 < 0x33333334)))) {
    confdir(&local_34a,&local_34b);
  }
  sVar4 = urole.malenum;
  local_340 = (long)local_34a + (long)u.ux;
  local_348 = (long)local_34b + (long)u.uy;
  pmVar3 = level->monsters[local_340][local_348];
  worm = (monst *)0x0;
  if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
    worm = pmVar3;
  }
  sVar6 = acurr(3);
  if (sVar6 < '\x06') {
    uVar13 = -(uint)(sVar4 != 0x159);
  }
  else {
    sVar6 = acurr(3);
    if (sVar6 < '\x0e') {
      uVar13 = (uint)(sVar4 == 0x159);
    }
    else {
      sVar6 = acurr(3);
      uVar13 = ((uint)(sVar4 == 0x159) + (int)sVar6) - 0xe;
    }
  }
  iVar7 = uVar13 - (u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0);
  iVar8 = 3;
  if (iVar7 < 3) {
    iVar8 = iVar7;
  }
  iVar14 = 0;
  if (0 < iVar8) {
    iVar14 = iVar8;
  }
  if (((u._1052_1_ & 1) != 0) && (bVar5 = attack(u.ustuck,local_34a,local_34b), bVar5 != '\0')) {
    pcVar15 = "There is not enough room to flick your bullwhip.";
    goto LAB_00144143;
  }
  if ((u._1052_1_ & 2) != 0) {
    pcVar15 = "There is too much resistance to flick your bullwhip.";
    goto LAB_00144143;
  }
  if (local_349 < '\0') {
    pcVar15 = ceiling((int)u.ux,(int)u.uy);
    pline("You flick a bug off of the %s.",pcVar15);
    return 1;
  }
  if ((local_349 != '\0') || (local_34b == '\0' && local_34a == '\0')) {
    if ((u.usteed != (monst *)0x0) && (uVar13 = mt_random(), uVar13 % (iVar14 + 2U) == 0)) {
      pcVar15 = mon_nam(u.usteed);
      pline("You whip %s!",pcVar15);
      kick_steed();
      return 1;
    }
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.usteed == (monst *)0x0)) ||
       (poVar11 = level->objects[u.ux][u.uy], poVar11 == (obj *)0x0)) {
LAB_001442a4:
      uVar13 = mt_random();
      iVar8 = dbon();
      iVar8 = (int)obj->spe + iVar8 + (uVar13 & 1) + 1;
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      pcVar15 = body_part(5);
      pline("You hit your %s with your bullwhip.",pcVar15);
      uVar10 = (ulong)((uint)(flags.female != '\0') * 0x30);
      sprintf(local_338,"killed %sself with %s bullwhip",
              *(undefined8 *)((long)&genders[0].him + uVar10),
              *(undefined8 *)((long)&genders[0].his + uVar10));
      losehp(iVar8,local_338,2);
      iflags.botl = '\x01';
      return 1;
    }
    if ((poVar11->otyp == 0x10e) && (poVar11->corpsenm == 0x6c)) {
      pcVar15 = "Why beat a dead horse?";
    }
    else {
      if (iVar7 < 1) goto LAB_001442a4;
      pcVar15 = singular(poVar11,xname);
      pcVar15 = an(pcVar15);
      pcVar9 = surface((int)u.ux,(int)u.uy);
      pline("You wrap your bullwhip around %s on the %s.",pcVar15,pcVar9);
      iVar8 = rnl(6);
      if ((iVar8 == 0) && (iVar8 = pickup_object(poVar11,1,'\x01'), 0 < iVar8)) {
        return 1;
      }
      pcVar15 = "The bullwhip slips free.";
    }
    goto LAB_00144143;
  }
  if ((((u.uprops[0x25].intrinsic != 0) || (u.uprops[0x25].extrinsic != 0)) ||
      (u.uprops[0x29].intrinsic != 0)) && (uVar13 = mt_random(), uVar13 * -0x33333333 < 0x33333334))
  {
    pcVar15 = body_part(6);
    pline("The bullwhip slips out of your %s.",pcVar15);
    dropx(obj);
    return 1;
  }
  if ((u.utrap == 0) || (u.utraptype != 1)) {
    if (worm != (monst *)0x0) {
      if (worm->wormno == '\0') {
        if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001445e3;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00144556;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014454d;
        }
        else {
LAB_0014454d:
          if (ublindf == (obj *)0x0) goto LAB_00144632;
LAB_00144556:
          if (ublindf->oartifact != '\x1d') goto LAB_00144632;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0))
        goto LAB_001445e3;
LAB_00144632:
        if (((worm->data->mflags1 & 0x10000) == 0) &&
           ((poVar11 = which_armor(worm,4), poVar11 == (obj *)0x0 ||
            (poVar11 = which_armor(worm,4), poVar11->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00144683;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014467e;
          }
          else {
LAB_0014467e:
            if (ublindf != (obj *)0x0) {
LAB_00144683:
              if (ublindf->oartifact == '\x1d') goto LAB_00144716;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001447a1;
          }
LAB_00144716:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar8 < 0x41))))
          goto LAB_001447a1;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           (((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(worm), bVar5 == '\0')) &&
            ((level->locations[local_340][local_348].field_0x6 & 8) == 0)))) {
          pline("A monster is there that you couldn\'t see.");
          map_invisible((xchar)local_340,(xchar)local_348);
        }
      }
      else {
        bVar5 = worm_known(level,worm);
        if (bVar5 == '\0') goto LAB_00144632;
LAB_001445e3:
        uVar13 = *(uint *)&worm->field_0x60;
        if ((((uVar13 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
           (u.uprops[0xc].extrinsic == 0)) {
          if (((uVar13 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_00144624;
          goto LAB_00144632;
        }
        if ((uVar13 & 0x280) != 0) goto LAB_00144632;
LAB_00144624:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_00144632;
      }
LAB_001447a1:
      poVar11 = worm->mw;
      if (poVar11 != (obj *)0x0) {
        if (iVar7 < 1) {
          bVar17 = true;
        }
        else if (u.uprops[0x25].extrinsic == 0 && u.uprops[0x25].intrinsic == 0) {
          bVar17 = false;
        }
        else {
          uVar13 = mt_random();
          bVar17 = 0x19999999 <
                   (uVar13 * -0x33333333 >> 1 | (uint)((uVar13 * -0x33333333 & 1) != 0) << 0x1f);
        }
        pcVar15 = cxname(poVar11);
        strcpy(local_338,pcVar15);
        if (bVar17) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = mbodypart(worm,6);
          if (((byte)(poVar11->oclass | 4U) == 6) && ((objects[poVar11->otyp].field_0x11 & 1) != 0))
          {
            pcVar15 = makeplural(pcVar15);
          }
        }
        pcVar9 = mon_nam(worm);
        pcVar9 = s_suffix(pcVar9);
        pline("You wrap your bullwhip around %s %s.",pcVar9,local_338);
        if (!bVar17) {
          if ((poVar11->field_0x4a & 1) == 0) {
            obj_extract_self(poVar11);
            possibly_unwield(worm,'\0');
            setmnotwielded(worm,poVar11);
            uVar13 = mt_random();
            uVar13 = uVar13 % (iVar14 + 1U);
            if (uVar13 == 3) {
              pcVar15 = mon_nam(worm);
              pcVar15 = s_suffix(pcVar15);
              pline("You snatch %s %s!",pcVar15,local_338);
              if ((((poVar11->otyp == 0x10e) &&
                   (((poVar11->corpsenm == 0xc || (poVar11->corpsenm == 0xb)) &&
                    (uarmg == (obj *)0x0)))) &&
                  ((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)))) &&
                 ((bVar5 = poly_when_stoned(youmonst.data), bVar5 == '\0' ||
                  (iVar8 = polymon(0x108), iVar8 == 0)))) {
                pcVar15 = mons_mname(mons + poVar11->corpsenm);
                pcVar15 = an(pcVar15);
                sprintf(&local_238[0].x,"%s corpse",pcVar15);
                sprintf(local_138,"Snatching %s is a fatal mistake.",local_238);
                bVar5 = delayed_petrify(local_138,&local_238[0].x);
                if (bVar5 != '\0') {
                  pcVar15 = doname(poVar11);
                  pline("You drop %s!",pcVar15);
                  dropy(poVar11);
                  goto LAB_00144a7f;
                }
              }
              pcVar15 = doname(poVar11);
              hold_another_object(poVar11,"You drop %s!",pcVar15,(char *)0x0);
            }
            else {
              if (uVar13 == 2) {
                pcVar15 = mon_nam(worm);
                pcVar15 = s_suffix(pcVar15);
                pcVar9 = surface((int)u.ux,(int)u.uy);
                pline("You yank %s %s to the %s!",pcVar15,local_338,pcVar9);
                cVar1 = u.ux;
                cVar2 = u.uy;
              }
              else {
                pcVar9 = the(local_338);
                pcVar12 = mon_nam(worm);
                pcVar12 = s_suffix(pcVar12);
                pline("You yank %s from %s %s!",pcVar9,pcVar12,pcVar15);
                obj_no_longer_held(poVar11);
                cVar1 = worm->mx;
                cVar2 = worm->my;
              }
              place_object(poVar11,level,(int)cVar1,(int)cVar2);
              stackobj(in_stack_fffffffffffffca8);
            }
            goto LAB_00144a7f;
          }
          pcVar9 = "They are";
          if (poVar11->quan == 1) {
            pcVar9 = "It is";
          }
          iVar8 = pronoun_gender(level,worm);
          uVar16 = 0x2e;
          if ((poVar11->field_0x4a & 0x40) == 0) {
            uVar16 = 0x21;
          }
          pline("%s welded to %s %s%c",pcVar9,genders[iVar8].his,pcVar15,uVar16);
          poVar11->field_0x4a = poVar11->field_0x4a | 0x40;
        }
        pline("The bullwhip slips free.");
        goto LAB_00144a7f;
      }
      if (((worm->m_ap_type != '\0') && (u.uprops[0x17].intrinsic == 0)) &&
         (u.uprops[0x17].extrinsic == 0)) {
        if (((worm->data->mflags1 & 0x10000) == 0) &&
           ((poVar11 = which_armor(worm,4), poVar11 == (obj *)0x0 ||
            (poVar11 = which_armor(worm,4), poVar11->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014485f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014485a;
          }
          else {
LAB_0014485a:
            if (ublindf != (obj *)0x0) {
LAB_0014485f:
              if (ublindf->oartifact == '\x1d') goto LAB_00144c56;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00144ca7;
          }
LAB_00144c56:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar8 < 0x41))))
          goto LAB_00144ca7;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(worm), bVar5 == '\0')))) {
          stumble_onto_mimic(worm,local_34a,local_34b);
          goto LAB_00144cc0;
        }
      }
LAB_00144ca7:
      pcVar15 = mon_nam(worm);
      pline("You flick your bullwhip towards %s.",pcVar15);
LAB_00144cc0:
      if (iVar7 < 1) {
        return 1;
      }
      bVar5 = attack(worm,local_34a,local_34b);
      if (bVar5 == '\0') {
        pline("Snap!");
        return 1;
      }
      return 1;
    }
    bVar5 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if ((bVar5 != '\0') || (bVar5 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar5 != '\0'))
    {
      pcVar15 = "You snap your whip through thin air.";
      goto LAB_00144143;
    }
LAB_00144561:
    pcVar15 = "Snap!";
LAB_00144143:
    pline(pcVar15);
    return 1;
  }
  if (worm == (monst *)0x0) {
LAB_00144406:
    if ((byte)(level->locations[local_340][local_348].typ - 0x1aU) < 8) {
      pcVar15 = "something";
    }
    else {
      poVar11 = sobj_at(0x214,level,(int)local_340,(int)local_348);
      if (poVar11 == (obj *)0x0) goto LAB_00144561;
      pcVar15 = "a boulder";
    }
  }
  else {
    if (worm->data->msize < 3) {
      if (0 < iVar7) {
        bVar5 = attack(worm,local_34a,local_34b);
        if (bVar5 != '\0') {
          return 1;
        }
        pline("Snap!");
      }
      goto LAB_00144406;
    }
    pcVar9 = mon_nam(worm);
    pcVar15 = local_338;
    strcpy(pcVar15,pcVar9);
  }
  local_238[0].x = (xchar)local_340;
  local_238[0].y = (xchar)local_348;
  pline("You wrap your bullwhip around %s.",pcVar15);
  if ((iVar7 < 1) || (uVar13 = mt_random(), uVar13 % (iVar14 + 2U) == 0)) {
    pline("The bullwhip slips free.");
  }
  else {
    if (worm != (monst *)0x0) {
      bVar5 = enexto(local_238,level,(xchar)local_340,(xchar)local_348,youmonst.data);
      if (bVar5 == '\0') goto LAB_00144a7f;
    }
    pline("You yank yourself out of the pit!");
    teleds((int)local_238[0].x,(int)local_238[0].y,'\x01');
    u.utrap = 0;
    vision_full_recalc = '\x01';
  }
  if (worm == (monst *)0x0) {
    return 1;
  }
LAB_00144a7f:
  wakeup(worm);
  return 1;
}

Assistant:

static int use_whip(struct obj *obj)
{
    char buf[BUFSZ];
    struct monst *mtmp;
    struct obj *otmp;
    int rx, ry, proficient, res = 0;
    const char *msg_slipsfree = "The bullwhip slips free.";
    const char *msg_snap = "Snap!";
    schar dx, dy, dz;

    if (obj != uwep) {
	if (!wield_tool(obj, "lash")) return 0;
	else res = 1;
    }
    
    if (!getdir(NULL, &dx, &dy, &dz))
	return res;

    if (Stunned || (Confusion && !rn2(5)))
	confdir(&dx, &dy);
    rx = u.ux + dx;
    ry = u.uy + dy;
    mtmp = m_at(level, rx, ry);

    /* fake some proficiency checks */
    proficient = 0;
    if (Role_if (PM_ARCHEOLOGIST)) ++proficient;
    if (ACURR(A_DEX) < 6) proficient--;
    else if (ACURR(A_DEX) >= 14) proficient += (ACURR(A_DEX) - 14);
    if (Fumbling) --proficient;
    if (proficient > 3) proficient = 3;
    if (proficient < 0) proficient = 0;

    if (u.uswallow && attack(u.ustuck, dx, dy)) {
	pline("There is not enough room to flick your bullwhip.");

    } else if (Underwater) {
	pline("There is too much resistance to flick your bullwhip.");

    } else if (dz < 0) {
	pline("You flick a bug off of the %s.",ceiling(u.ux,u.uy));

    } else if ((!dx && !dy) || (dz > 0)) {
	int dam;

	/* Sometimes you hit your steed by mistake */
	if (u.usteed && !rn2(proficient + 2)) {
	    pline("You whip %s!", mon_nam(u.usteed));
	    kick_steed();
	    return 1;
	}

	if (Levitation || u.usteed) {
	    /* Have a shot at snaring something on the floor */
	    otmp = level->objects[u.ux][u.uy];
	    if (otmp && otmp->otyp == CORPSE && otmp->corpsenm == PM_HORSE) {
		pline("Why beat a dead horse?");
		return 1;
	    }
	    if (otmp && proficient) {
		pline("You wrap your bullwhip around %s on the %s.",
		    an(singular(otmp, xname)), surface(u.ux, u.uy));
		if (rnl(6) || pickup_object(otmp, 1L, TRUE) < 1)
		    pline(msg_slipsfree);
		return 1;
	    }
	}
	dam = rnd(2) + dbon() + obj->spe;
	if (dam <= 0)
	    dam = 1;
	pline("You hit your %s with your bullwhip.", body_part(FOOT));
	sprintf(buf, "killed %sself with %s bullwhip", uhim(), uhis());
	losehp(dam, buf, NO_KILLER_PREFIX);
	iflags.botl = 1;
	return 1;

    } else if ((Fumbling || Glib) && !rn2(5)) {
	pline("The bullwhip slips out of your %s.", body_part(HAND));
	dropx(obj);

    } else if (u.utrap && u.utraptype == TT_PIT) {
	/*
	 *     Assumptions:
	 *
	 *	if you're in a pit
	 *		- you are attempting to get out of the pit
	 *		- or, if you are applying it towards a small
	 *		  monster then it is assumed that you are
	 *		  trying to hit it.
	 *	else if the monster is wielding a weapon
	 *		- you are attempting to disarm a monster
	 *	else
	 *		- you are attempting to hit the monster
	 *
	 *	if you're confused (and thus off the mark)
	 *		- you only end up hitting.
	 *
	 */
	const char *wrapped_what = NULL;

	if (mtmp) {
	    if (bigmonst(mtmp->data)) {
		wrapped_what = strcpy(buf, mon_nam(mtmp));
	    } else if (proficient) {
		if (attack(mtmp, dx, dy)) return 1;
		else pline(msg_snap);
	    }
	}
	if (!wrapped_what) {
	    if (IS_FURNITURE(level->locations[rx][ry].typ))
		wrapped_what = "something";
	    else if (sobj_at(BOULDER, level, rx, ry))
		wrapped_what = "a boulder";
	}
	if (wrapped_what) {
	    coord cc;

	    cc.x = rx; cc.y = ry;
	    pline("You wrap your bullwhip around %s.", wrapped_what);
	    if (proficient && rn2(proficient + 2)) {
		if (!mtmp || enexto(&cc, level, rx, ry, youmonst.data)) {
		    pline("You yank yourself out of the pit!");
		    teleds(cc.x, cc.y, TRUE);
		    u.utrap = 0;
		    vision_full_recalc = 1;
		}
	    } else {
		pline(msg_slipsfree);
	    }
	    if (mtmp) wakeup(mtmp);
	} else pline(msg_snap);

    } else if (mtmp) {
	if (!canspotmon(level, mtmp) &&
		!level->locations[rx][ry].mem_invis) {
	   pline("A monster is there that you couldn't see.");
	   map_invisible(rx, ry);
	}
	otmp = MON_WEP(mtmp);	/* can be null */
	if (otmp) {
	    char onambuf[BUFSZ];
	    const char *mon_hand;
	    boolean gotit = proficient && (!Fumbling || !rn2(10));

	    strcpy(onambuf, cxname(otmp));
	    if (gotit) {
		mon_hand = mbodypart(mtmp, HAND);
		if (bimanual(otmp)) mon_hand = makeplural(mon_hand);
	    } else
		mon_hand = 0;	/* lint suppression */

	    pline("You wrap your bullwhip around %s %s.",
		s_suffix(mon_nam(mtmp)), onambuf);
	    if (gotit && otmp->cursed) {
		pline("%s welded to %s %s%c",
		      (otmp->quan == 1L) ? "It is" : "They are",
		      mhis(level, mtmp), mon_hand,
		      !otmp->bknown ? '!' : '.');
		otmp->bknown = 1;
		gotit = FALSE;	/* can't pull it free */
	    }
	    if (gotit) {
		obj_extract_self(otmp);
		possibly_unwield(mtmp, FALSE);
		setmnotwielded(mtmp,otmp);

		switch (rn2(proficient + 1)) {
		case 2:
		    /* to floor near you */
		    pline("You yank %s %s to the %s!", s_suffix(mon_nam(mtmp)),
			onambuf, surface(u.ux, u.uy));
		    place_object(otmp, level, u.ux, u.uy);
		    stackobj(otmp);
		    break;
		case 3:
		    /* right to you */
		    /* right into your inventory */
		    pline("You snatch %s %s!", s_suffix(mon_nam(mtmp)), onambuf);
		    if (otmp->otyp == CORPSE &&
			    touch_petrifies(&mons[otmp->corpsenm]) &&
			    !uarmg && !Stone_resistance &&
			    !(poly_when_stoned(youmonst.data) &&
				polymon(PM_STONE_GOLEM))) {
			char kbuf[BUFSZ];
			char premsg[BUFSZ];
			sprintf(kbuf, "%s corpse",
				an(mons_mname(&mons[otmp->corpsenm])));
			sprintf(premsg, "Snatching %s is a fatal mistake.", kbuf);
			if (delayed_petrify(premsg, kbuf)) {
			    pline("You drop %s!", doname(otmp));
			    dropy(otmp);
			    break;
			}
		    }
		    hold_another_object(otmp, "You drop %s!",
					       doname(otmp), NULL);
		    break;
		default:
		    /* to floor beneath mon */
		    pline("You yank %s from %s %s!", the(onambuf),
			s_suffix(mon_nam(mtmp)), mon_hand);
		    obj_no_longer_held(otmp);
		    place_object(otmp, level, mtmp->mx, mtmp->my);
		    stackobj(otmp);
		    break;
		}
	    } else {
		pline(msg_slipsfree);
	    }
	    wakeup(mtmp);
	} else {
	    if (mtmp->m_ap_type &&
		!Protection_from_shape_changers && !sensemon(mtmp))
		stumble_onto_mimic(mtmp, dx, dy);
	    else pline("You flick your bullwhip towards %s.", mon_nam(mtmp));
	    if (proficient) {
		if (attack(mtmp, dx, dy))
		    return 1;
		else
		    pline(msg_snap);
	    }
	}

    } else if (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz)) {
	    /* it must be air -- water checked above */
	    pline("You snap your whip through thin air.");

    } else {
	pline(msg_snap);

    }
    return 1;
}